

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O0

void __thiscall SceneParser::SceneParser(SceneParser *this,string *filename)

{
  string *psVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  char *__filename;
  FILE *pFVar5;
  Sampler *this_00;
  Vector3f local_130;
  allocator local_121;
  string local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [39];
  allocator local_b9;
  string local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [8];
  string ext;
  string local_78 [32];
  long local_58;
  size_t last_sep;
  string local_48 [48];
  string *local_18;
  string *filename_local;
  SceneParser *this_local;
  
  local_18 = filename;
  filename_local = (string *)this;
  std::vector<Object3D_*,_std::allocator<Object3D_*>_>::vector(&this->lights);
  std::__cxx11::string::string((string *)&this->_basepath);
  this->_file = (FILE *)0x0;
  this->_camera = (Camera *)0x0;
  Vector3f::Vector3f(&this->_background_color,0.5,0.5,0.5);
  Vector3f::Vector3f(&this->_ambient_light,0.0,0.0,0.0);
  this->_num_lights = 0;
  this->_num_materials = 0;
  std::vector<Material_*,_std::allocator<Material_*>_>::vector(&this->_materials);
  std::vector<Object3D_*,_std::allocator<Object3D_*>_>::vector(&this->_objects);
  this->_current_material = (Material *)0x0;
  this->_group = (Group *)0x0;
  this->_cubemap = (CubeMap *)0x0;
  bVar2 = std::__cxx11::string::empty();
  if (((bVar2 ^ 0xff) & 1) != 0) {
    uVar4 = std::__cxx11::string::size();
    if (uVar4 < 5) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_48,"ERROR: Wrong file name extension\n",(allocator *)((long)&last_sep + 7));
      _PostError((string *)local_48);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)((long)&last_sep + 7));
    }
    local_58 = std::__cxx11::string::find_last_of((char *)local_18,0x15dae5);
    if (local_58 == -1) {
      std::__cxx11::string::operator=((string *)&this->_basepath,"");
    }
    else {
      std::__cxx11::string::substr((ulong)local_78,(ulong)local_18);
      std::__cxx11::string::operator=((string *)&this->_basepath,local_78);
      std::__cxx11::string::~string(local_78);
    }
    psVar1 = local_18;
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_98,(ulong)psVar1);
    bVar3 = std::operator!=(local_98,".txt");
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"ERROR: Wrong file name extension\n",&local_b9);
      _PostError((string *)local_b8);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    }
    __filename = (char *)std::__cxx11::string::c_str();
    pFVar5 = fopen(__filename,"r");
    this->_file = (FILE *)pFVar5;
    if (this->_file == (FILE *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_120,"Cannot open scene file ",&local_121);
      std::operator+(local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120)
      ;
      std::operator+(local_e0,(char *)local_100);
      _PostError(local_e0);
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::~string((string *)local_100);
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
    }
    parseFile(this);
    fclose((FILE *)this->_file);
    this->_file = (FILE *)0x0;
    bVar3 = std::vector<Object3D_*,_std::allocator<Object3D_*>_>::empty(&this->lights);
    if (bVar3) {
      std::operator<<((ostream *)&std::cerr,"WARNING: No lights specified\n");
      Vector3f::Vector3f(&local_130,1.0,1.0,1.0);
      Vector3f::operator=(&this->_ambient_light,&local_130);
    }
    this_00 = (Sampler *)operator_new(8);
    experimental::experimental((experimental *)this_00);
    this->sampler = this_00;
    std::__cxx11::string::~string((string *)local_98);
    return;
  }
  __assert_fail("!filename.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                ,0x23,"SceneParser::SceneParser(const std::string &)");
}

Assistant:

SceneParser::SceneParser(const std::string &filename) :
        _file(NULL),
        _camera(NULL),
        _background_color(0.5, 0.5, 0.5),
        _ambient_light(0, 0, 0),
        _num_lights(0),
        _num_materials(0),
        _current_material(NULL),
        _group(NULL),
        _cubemap(NULL) {
    // Parse the file.
    assert(!filename.empty());

    if (filename.size() <= 4) {
        _PostError("ERROR: Wrong file name extension\n");
    }

    size_t last_sep = filename.find_last_of("\\/");
    if (last_sep == std::string::npos) {
        _basepath = "";
    } else {
        _basepath = filename.substr(0, last_sep + 1);
    }

    std::string ext = filename.substr(filename.size() - 4, 4);
    if (ext != ".txt") {
        _PostError("ERROR: Wrong file name extension\n");
    }

    _file = fopen(filename.c_str(), "r");

    // FIXME extract base path from scene file path
    if (_file == NULL) {
        _PostError(std::string("Cannot open scene file ") + filename + "\n");
    }

    parseFile();
    fclose(_file);
    _file = NULL;

    // If no lights are specified, set ambient light to white
    // (do solid color ray casting).
    if (lights.empty()) {
        std::cerr << "WARNING: No lights specified\n";
        _ambient_light = Vector3f(1, 1, 1);
    }

    sampler = new experimental;
}